

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paint.h
# Opt level: O2

void gimage::drawLine<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,long x1,long y1,
               long x2,long y2,float r,float g,float b)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uchar local_23 [3];
  uchar v [3];
  
  local_23[0] = (uchar)(int)r;
  local_23[1] = (char)(int)(float)(~-(uint)(g < 0.0) & (uint)g | -(uint)(g < 0.0) & (uint)r);
  local_23[2] = (char)(int)(float)(~-(uint)(b < 0.0) & (uint)b | -(uint)(b < 0.0) & (uint)r);
  uVar5 = 3;
  if (image->depth < 3) {
    uVar5 = image->depth;
  }
  uVar7 = x2 - x1;
  uVar8 = y2 - y1;
  if (uVar7 == 0 && uVar8 == 0) {
    if (((-1 < (y1 | x1)) && (x1 < image->width)) && (y1 < image->height)) {
      uVar8 = 0;
      uVar7 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        image->img[uVar8][y1][x1] = local_23[uVar8];
      }
    }
  }
  else {
    uVar2 = -uVar7;
    uVar6 = uVar7;
    if ((long)uVar7 < 1) {
      uVar6 = uVar2;
    }
    uVar9 = -uVar8;
    uVar10 = uVar8;
    if ((long)uVar8 < 1) {
      uVar10 = uVar9;
    }
    if (uVar10 < uVar6) {
      lVar1 = x2;
      if ((long)uVar7 < 0) {
        uVar7 = -uVar7;
        uVar8 = -uVar8;
        lVar1 = x1;
        x1 = x2;
        y1 = y2;
      }
      lVar4 = 0;
      if (0 < x1) {
        lVar4 = x1;
      }
      lVar3 = image->width + -1;
      if (lVar1 < image->width) {
        lVar3 = lVar1;
      }
      uVar6 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar6 = 0;
      }
      for (; lVar4 <= lVar3; lVar4 = lVar4 + 1) {
        lVar1 = (long)((lVar4 - x1) * uVar8) / (long)uVar7 + y1;
        if ((-1 < lVar1) && (lVar1 < image->height)) {
          for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
            image->img[uVar2][lVar1][lVar4] = local_23[uVar2];
          }
        }
      }
    }
    else {
      lVar1 = y1;
      if (-1 < (long)uVar8) {
        x2 = x1;
        lVar1 = y2;
        uVar2 = uVar7;
        y2 = y1;
        uVar9 = uVar8;
      }
      lVar4 = 0;
      if (0 < y2) {
        lVar4 = y2;
      }
      lVar3 = image->height + -1;
      if (lVar1 < image->height) {
        lVar3 = lVar1;
      }
      uVar7 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar7 = 0;
      }
      for (; lVar4 <= lVar3; lVar4 = lVar4 + 1) {
        lVar1 = (long)((lVar4 - y2) * uVar2) / (long)uVar9 + x2;
        if ((-1 < lVar1) && (lVar1 < image->width)) {
          for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
            image->img[uVar8][lVar4][lVar1] = local_23[uVar8];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void drawLine(Image<T> &image, long x1, long y1, long x2,
                                long y2, float r, float g=-1, float b=-1)
{
  T v[3];

  if (g < 0)
  {
    g=r;
  }

  if (b < 0)
  {
    b=r;
  }

  v[0]=static_cast<T>(r);
  v[1]=static_cast<T>(g);
  v[2]=static_cast<T>(b);

  int cn=std::min(3, image.getDepth());

  long dx=x2-x1;
  long dy=y2-y1;

  if (dx != 0 || dy != 0)
  {
    long adx=std::abs(dx);
    long ady=std::abs(dy);

    if (adx > ady)
    {
      long i, n;

      if (dx >= 0)
      {
        i=x1;
        n=x2;
      }
      else
      {
        i=x2;
        n=x1;
        dx=-dx;
        dy=-dy;
        x1=x2;
        y1=y2;
      }

      if (i < 0)
      {
        i=0;
      }

      if (n > image.getWidth()-1)
      {
        n=image.getWidth()-1;
      }

      while (i <= n)
      {
        long k=y1+(i-x1)*dy/dx;

        if (k >= 0 && k < image.getHeight())
        {
          for (int c=0; c<cn; c++)
          {
            image.set(i, k, c, v[c]);
          }
        }

        i++;
      }
    }
    else
    {
      long k, n;

      if (dy >= 0)
      {
        k=y1;
        n=y2;
      }
      else
      {
        k=y2;
        n=y1;
        dx=-dx;
        dy=-dy;
        x1=x2;
        y1=y2;
      }

      if (k < 0)
      {
        k=0;
      }

      if (n > image.getHeight()-1)
      {
        n=image.getHeight()-1;
      }

      while (k <= n)
      {
        long i=x1+(k-y1)*dx/dy;

        if (i >= 0 && i < image.getWidth())
        {
          for (int c=0; c<cn; c++)
          {
            image.set(i, k, c, v[c]);
          }
        }

        k++;
      }
    }
  }
  else
  {
    if (x1 >= 0 && y1 >= 0 && x1 < image.getWidth() && y1 < image.getHeight())
    {
      for (int c=0; c<cn; c++)
      {
        image.set(x1, y1, c, v[c]);
      }
    }
  }
}